

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acbp_v1.cpp
# Opt level: O3

void __thiscall intel_acbp_v1_t::pmda_body_t::_read(pmda_body_t *this)

{
  vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>>>>
  *this_00;
  vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>>>>
  *this_01;
  uint16_t uVar1;
  uint32_t uVar2;
  pointer __p;
  pointer __p_00;
  pmda_entry_v1_t *this_02;
  pointer __p_01;
  pmda_entry_v2_t *this_03;
  _Head_base<0UL,_std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>_*,_false>
  local_30;
  
  uVar1 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
  this->m_total_size = uVar1;
  uVar2 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_version = uVar2;
  uVar2 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_num_entries = uVar2;
  this->n_entries_v1 = true;
  uVar2 = this->m_version;
  if (uVar2 == 1) {
    this->n_entries_v1 = false;
    __p_00 = (pointer)operator_new(0x18);
    (__p_00->
    super__Vector_base<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__p_00->
    super__Vector_base<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__p_00->
    super__Vector_base<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_30._M_head_impl =
         (vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>
          *)0x0;
    std::
    __uniq_ptr_impl<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>_>_>
    ::reset((__uniq_ptr_impl<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>_>_>
             *)&this->m_entries_v1,__p_00);
    std::
    unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>_>_>
                   *)&local_30);
    uVar2 = this->m_num_entries;
    if (0 < (int)uVar2) {
      do {
        this_00 = (vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>>>>
                   *)(this->m_entries_v1)._M_t.
                     super___uniq_ptr_impl<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>_>_>
                     .
                     super__Head_base<0UL,_std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>_*,_false>
                     ._M_head_impl;
        this_02 = (pmda_entry_v1_t *)operator_new(0x48);
        pmda_entry_v1_t::pmda_entry_v1_t(this_02,(this->super_kstruct).m__io,this,this->m__root);
        local_30._M_head_impl =
             (vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>
              *)this_02;
        std::
        vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>>>>
        ::
        emplace_back<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>>>
                  (this_00,(unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>
                            *)&local_30);
        if ((pmda_entry_v1_t *)local_30._M_head_impl != (pmda_entry_v1_t *)0x0) {
          (*(code *)((local_30._M_head_impl)->
                    super__Vector_base<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                    super___uniq_ptr_impl<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>
          )();
        }
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
    uVar2 = this->m_version;
  }
  this->n_entries_v2 = true;
  if (uVar2 == 2) {
    this->n_entries_v2 = false;
    __p_01 = (pointer)operator_new(0x18);
    (__p_01->
    super__Vector_base<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__p_01->
    super__Vector_base<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__p_01->
    super__Vector_base<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_30._M_head_impl =
         (vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>
          *)0x0;
    std::
    __uniq_ptr_impl<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>_>_>_>_>
    ::reset((__uniq_ptr_impl<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>_>_>_>_>
             *)&this->m_entries_v2,__p_01);
    std::
    unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>_>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>_>_>_>_>
                   *)&local_30);
    uVar2 = this->m_num_entries;
    if (0 < (int)uVar2) {
      do {
        this_01 = (vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>>>>
                   *)(this->m_entries_v2)._M_t.
                     super___uniq_ptr_impl<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>_>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>_>_>_>_>
                     .
                     super__Head_base<0UL,_std::vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>_>_>_*,_false>
                     ._M_head_impl;
        this_03 = (pmda_entry_v2_t *)operator_new(0x30);
        pmda_entry_v2_t::pmda_entry_v2_t(this_03,(this->super_kstruct).m__io,this,this->m__root);
        local_30._M_head_impl =
             (vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>
              *)this_03;
        std::
        vector<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>>>>
        ::
        emplace_back<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>>>
                  (this_01,(unique_ptr<intel_acbp_v1_t::pmda_entry_v2_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v2_t>_>
                            *)&local_30);
        if ((pmda_entry_v2_t *)local_30._M_head_impl != (pmda_entry_v2_t *)0x0) {
          (*(code *)((local_30._M_head_impl)->
                    super__Vector_base<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                    super___uniq_ptr_impl<intel_acbp_v1_t::pmda_entry_v1_t,_std::default_delete<intel_acbp_v1_t::pmda_entry_v1_t>_>
          )();
        }
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
  }
  return;
}

Assistant:

void intel_acbp_v1_t::pmda_body_t::_read() {
    m_total_size = m__io->read_u2le();
    m_version = m__io->read_u4le();
    m_num_entries = m__io->read_u4le();
    n_entries_v1 = true;
    if (version() == 1) {
        n_entries_v1 = false;
        m_entries_v1 = std::unique_ptr<std::vector<std::unique_ptr<pmda_entry_v1_t>>>(new std::vector<std::unique_ptr<pmda_entry_v1_t>>());
        const int l_entries_v1 = num_entries();
        for (int i = 0; i < l_entries_v1; i++) {
            m_entries_v1->push_back(std::move(std::unique_ptr<pmda_entry_v1_t>(new pmda_entry_v1_t(m__io, this, m__root))));
        }
    }
    n_entries_v2 = true;
    if (version() == 2) {
        n_entries_v2 = false;
        m_entries_v2 = std::unique_ptr<std::vector<std::unique_ptr<pmda_entry_v2_t>>>(new std::vector<std::unique_ptr<pmda_entry_v2_t>>());
        const int l_entries_v2 = num_entries();
        for (int i = 0; i < l_entries_v2; i++) {
            m_entries_v2->push_back(std::move(std::unique_ptr<pmda_entry_v2_t>(new pmda_entry_v2_t(m__io, this, m__root))));
        }
    }
}